

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase414::run(TestCase414 *this)

{
  FsNode *pFVar1;
  size_t sVar2;
  EVP_PKEY_CTX *pEVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  char *ptrCopy;
  bool bVar9;
  StringPtr text;
  StringPtr text_00;
  Own<kj::File> dest;
  String bigString;
  Own<kj::File> source;
  TestClock clock;
  undefined8 *local_98;
  FsNode *local_90;
  String local_88;
  undefined8 *local_68;
  EVP_PKEY_CTX *local_60;
  TestClock local_58;
  String local_48;
  
  local_58.super_Clock._vptr_Clock = (_func_int **)&PTR_now_004592c0;
  local_58.time.value.value = (Quantity<long,_kj::_::NanosecondLabel>)1000000000;
  newInMemoryFile((kj *)&local_68,&local_58.super_Clock);
  text.content.size_ = 10;
  text.content.ptr = "foobarbaz";
  File::writeAll((File *)local_60,text);
  newInMemoryFile((kj *)&local_98,&local_58.super_Clock);
  text_00.content.size_ = 9;
  text_00.content.ptr = "quxcorge";
  File::writeAll((File *)local_90,text_00);
  TestClock::expectChanged(&local_58,local_90);
  iVar4 = File::copy((File *)local_90,(EVP_PKEY_CTX *)0x3,local_60);
  if ((CONCAT44(extraout_var,iVar4) != 3) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[68]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1a8,ERROR,
               "\"failed: expected \" \"dest->File::copy(3, *source, 6, kj::maxValue) == 3\"",
               (char (*) [68])"failed: expected dest->File::copy(3, *source, 6, kj::maxValue) == 3")
    ;
  }
  TestClock::expectChanged(&local_58,local_90);
  ReadableFile::readAllText(&local_88,(ReadableFile *)local_90);
  sVar2 = local_88.content.size_;
  bVar9 = true;
  if ((char *)local_88.content.size_ == (char *)0x9) {
    iVar4 = bcmp(local_88.content.ptr,"quxbazge",8);
    bVar9 = iVar4 != 0;
  }
  pcVar5 = local_88.content.ptr;
  if (local_88.content.ptr != (char *)0x0) {
    local_88.content.ptr = (char *)0x0;
    local_88.content.size_ = 0;
    (**(local_88.content.disposer)->_vptr_ArrayDisposer)
              (local_88.content.disposer,pcVar5,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar9 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[51]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1aa,ERROR,"\"failed: expected \" \"dest->readAllText() == \\\"quxbazge\\\"\"",
               (char (*) [51])"failed: expected dest->readAllText() == \"quxbazge\"");
  }
  iVar4 = File::copy((File *)local_90,(EVP_PKEY_CTX *)0x0,local_60);
  if ((CONCAT44(extraout_var_00,iVar4) != 4) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1ac,ERROR,"\"failed: expected \" \"dest->File::copy(0, *source, 3, 4) == 4\"",
               (char (*) [57])"failed: expected dest->File::copy(0, *source, 3, 4) == 4");
  }
  TestClock::expectChanged(&local_58,local_90);
  ReadableFile::readAllText(&local_88,(ReadableFile *)local_90);
  sVar2 = local_88.content.size_;
  bVar9 = true;
  if ((char *)local_88.content.size_ == (char *)0x9) {
    iVar4 = bcmp(local_88.content.ptr,"barbazge",8);
    bVar9 = iVar4 != 0;
  }
  pcVar5 = local_88.content.ptr;
  if (local_88.content.ptr != (char *)0x0) {
    local_88.content.ptr = (char *)0x0;
    local_88.content.size_ = 0;
    (**(local_88.content.disposer)->_vptr_ArrayDisposer)
              (local_88.content.disposer,pcVar5,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar9 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[51]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1ae,ERROR,"\"failed: expected \" \"dest->readAllText() == \\\"barbazge\\\"\"",
               (char (*) [51])"failed: expected dest->readAllText() == \"barbazge\"");
  }
  iVar4 = File::copy((File *)local_90,(EVP_PKEY_CTX *)0x0,local_60);
  if ((CONCAT44(extraout_var_01,iVar4) != 0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[70]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1b0,ERROR,
               "\"failed: expected \" \"dest->File::copy(0, *source, 128, kj::maxValue) == 0\"",
               (char (*) [70])
               "failed: expected dest->File::copy(0, *source, 128, kj::maxValue) == 0");
  }
  TestClock::expectUnchanged(&local_58,local_90);
  pcVar5 = (char *)0x3;
  iVar4 = File::copy((File *)local_90,(EVP_PKEY_CTX *)&DAT_00000004,local_60);
  if ((CONCAT44(extraout_var_02,iVar4) != 0) && (_::Debug::minSeverity < 3)) {
    pcVar5 = "\"failed: expected \" \"dest->File::copy(4, *source, 3, 0) == 0\"";
    _::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1b3,ERROR,"\"failed: expected \" \"dest->File::copy(4, *source, 3, 0) == 0\"",
               (char (*) [57])"failed: expected dest->File::copy(4, *source, 3, 0) == 0");
  }
  TestClock::expectUnchanged(&local_58,local_90);
  local_48.content.ptr = "foobar";
  local_48.content.size_ = 10000;
  strArray<kj::Repeat<char_const*>>
            (&local_88,(kj *)&local_48,(Repeat<const_char_*> *)0x385fb3,pcVar5);
  pcVar5 = (char *)0x0;
  if ((char *)local_88.content.size_ != (char *)0x0) {
    pcVar5 = (char *)(local_88.content.size_ + -1);
  }
  (**(code **)(*(long *)local_60 + 0x58))(local_60,pcVar5 + 1000);
  pcVar5 = (char *)local_88.content.size_;
  if ((char *)local_88.content.size_ != (char *)0x0) {
    pcVar5 = local_88.content.ptr;
  }
  pcVar6 = (char *)0x0;
  if ((char *)local_88.content.size_ != (char *)0x0) {
    pcVar6 = (char *)(local_88.content.size_ + -1);
  }
  (**(code **)(*(long *)local_60 + 0x48))(local_60,0x7b,pcVar5,pcVar6);
  File::copy((File *)local_90,(EVP_PKEY_CTX *)0x141,local_60);
  ReadableFile::readAllText(&local_48,(ReadableFile *)local_90);
  sVar2 = local_48.content.size_;
  pcVar5 = local_48.content.ptr;
  lVar7 = local_48.content.size_ + (local_48.content.size_ == 0);
  bVar9 = true;
  if ((char *)(lVar7 + -0x141) ==
      (char *)(local_88.content.size_ + ((char *)local_88.content.size_ == (char *)0x0))) {
    pcVar6 = "";
    if ((char *)local_88.content.size_ != (char *)0x0) {
      pcVar6 = local_88.content.ptr;
    }
    pcVar8 = "";
    if (local_48.content.size_ != 0) {
      pcVar8 = local_48.content.ptr;
    }
    iVar4 = bcmp(pcVar8 + 0x141,pcVar6,lVar7 - 0x142);
    bVar9 = iVar4 != 0;
  }
  if (pcVar5 != (char *)0x0) {
    local_48.content.ptr = (char *)0x0;
    local_48.content.size_ = 0;
    (**(local_48.content.disposer)->_vptr_ArrayDisposer)
              (local_48.content.disposer,pcVar5,1,sVar2,sVar2,0);
  }
  if ((bool)(bVar9 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x1bb,ERROR,"\"failed: expected \" \"dest->readAllText().slice(321) == bigString\"",
               (char (*) [61])"failed: expected dest->readAllText().slice(321) == bigString");
  }
  sVar2 = local_88.content.size_;
  pcVar5 = local_88.content.ptr;
  if (local_88.content.ptr != (char *)0x0) {
    local_88.content.ptr = (char *)0x0;
    local_88.content.size_ = 0;
    (**(local_88.content.disposer)->_vptr_ArrayDisposer)
              (local_88.content.disposer,pcVar5,1,sVar2,sVar2,0);
  }
  pFVar1 = local_90;
  if (local_90 != (FsNode *)0x0) {
    local_90 = (FsNode *)0x0;
    (**(code **)*local_98)(local_98,pFVar1->_vptr_FsNode[-2] + (long)&pFVar1->_vptr_FsNode);
  }
  pEVar3 = local_60;
  if (local_60 != (EVP_PKEY_CTX *)0x0) {
    local_60 = (EVP_PKEY_CTX *)0x0;
    (**(code **)*local_68)(local_68,pEVar3 + *(long *)(*(long *)pEVar3 + -0x10));
  }
  return;
}

Assistant:

void tick() {
    time += 1 * SECONDS;
  }